

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

string * __thiscall
VulkanHppGenerator::generateCommandVoid
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *name,
          CommandData *commandData,size_t initialSkipCount,bool definition,bool raii)

{
  long lVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> returnParams;
  
  determineReturnParams(&returnParams,this,&commandData->params);
  lVar1 = (long)returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3;
  if (lVar1 == 2) {
    generateCommandVoid2Return
              (__return_storage_ptr__,this,name,commandData,initialSkipCount,definition,
               &returnParams,raii);
  }
  else if (lVar1 == 1) {
    generateCommandVoid1Return
              (__return_storage_ptr__,this,name,commandData,initialSkipCount,definition,
               *returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start,raii);
  }
  else if (lVar1 == 0) {
    generateCommandVoid0Return
              (__return_storage_ptr__,this,name,commandData,initialSkipCount,definition,raii);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  if (returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)returnParams.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)returnParams.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateCommandVoid(
  std::string const & name, CommandData const & commandData, size_t initialSkipCount, bool definition, bool raii ) const
{
  std::vector<size_t> returnParams = determineReturnParams( commandData.params );
  switch ( returnParams.size() )
  {
    case 0 : return generateCommandVoid0Return( name, commandData, initialSkipCount, definition, raii );
    case 1 : return generateCommandVoid1Return( name, commandData, initialSkipCount, definition, returnParams[0], raii );
    case 2 : return generateCommandVoid2Return( name, commandData, initialSkipCount, definition, returnParams, raii );
    default: break;
  }
  return "";
}